

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O0

bool __thiscall xray_re::xr_image::save_tga(xr_image *this,char *path,char *name)

{
  xr_memory_writer *__s;
  char *path_00;
  bool bVar1;
  xr_memory_writer *pxVar2;
  allocator<char> local_59;
  string local_58;
  byte local_35;
  bool status;
  xr_memory_writer *local_28;
  xr_memory_writer *w;
  char *name_local;
  char *path_local;
  xr_image *this_local;
  
  w = (xr_memory_writer *)name;
  name_local = path;
  path_local = (char *)this;
  pxVar2 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(pxVar2);
  local_28 = pxVar2;
  save_tga(this,(xr_writer *)pxVar2);
  path_00 = name_local;
  __s = w;
  pxVar2 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  bVar1 = xr_memory_writer::save_to(pxVar2,path_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_35 = bVar1;
  if (local_28 != (xr_memory_writer *)0x0) {
    (*(local_28->super_xr_writer)._vptr_xr_writer[1])();
  }
  return (bool)(local_35 & 1);
}

Assistant:

bool xr_image::save_tga(const char* path, const char* name) const
{
	xr_memory_writer* w = new xr_memory_writer();
	save_tga(*w);
	bool status = w->save_to(path, name);
	delete w;
	return status;
}